

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O3

Literal * __thiscall
wasm::Literal::min(Literal *__return_storage_ptr__,Literal *this,Literal *other)

{
  ulong uVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  double dVar5;
  Literal local_28;
  
  uVar1 = (this->type).id;
  if (6 < uVar1) {
    __assert_fail("isBasic() && \"Basic type expected\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-type.h"
                  ,0xc6,"BasicType wasm::Type::getBasic() const");
  }
  if ((int)uVar1 == 5) {
    if ((uVar1 != 5) || ((other->type).id != 5)) {
      __assert_fail("type == Type::f64",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/literal.h"
                    ,0x129,"double wasm::Literal::getf64() const");
    }
    local_28.field_0.i64 = *(undefined8 *)&this->field_0;
    uVar3 = (undefined4)local_28.field_0.i64;
    uVar4 = (undefined4)(local_28.field_0.func.super_IString.str._M_len >> 0x20);
    if (NAN((double)local_28.field_0.i64)) {
      local_28.type.id = 5;
      standardizeNaN(__return_storage_ptr__,&local_28);
    }
    else {
      dVar5 = *(double *)&other->field_0;
      if (!NAN(dVar5)) {
        if ((((double)local_28.field_0.i64 != 0.0) || ((double)local_28.field_0.i64 != dVar5)) ||
           (NAN((double)local_28.field_0.i64) || NAN(dVar5))) {
          if ((double)local_28.field_0.i64 <= dVar5) {
            dVar5 = (double)local_28.field_0.i64;
          }
          *(double *)&__return_storage_ptr__->field_0 = dVar5;
        }
        else {
          if (-1 < local_28.field_0.i64) {
            uVar3 = SUB84(dVar5,0);
            uVar4 = (undefined4)((ulong)dVar5 >> 0x20);
          }
          (__return_storage_ptr__->field_0).i64 = CONCAT44(uVar4,uVar3);
        }
        (__return_storage_ptr__->type).id = 5;
        return __return_storage_ptr__;
      }
      local_28.type.id = 5;
      local_28.field_0._0_8_ = dVar5;
      standardizeNaN(__return_storage_ptr__,&local_28);
    }
  }
  else {
    if ((int)uVar1 != 4) {
      handle_unreachable("unexpected type",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                         ,0x5e2);
    }
    if ((uVar1 != 4) || ((other->type).id != 4)) {
      __assert_fail("type == Type::f32",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/literal.h"
                    ,0x125,"float wasm::Literal::getf32() const");
    }
    fVar2 = *(float *)&this->field_0;
    if (NAN(fVar2)) {
      local_28.field_0._0_4_ = fVar2;
      local_28.type.id = 4;
      standardizeNaN(__return_storage_ptr__,&local_28);
    }
    else {
      local_28.field_0.i32 = *(undefined4 *)&other->field_0;
      if (!NAN((float)local_28.field_0.i32)) {
        if (((fVar2 != 0.0) || (fVar2 != (float)local_28.field_0.i32)) ||
           (NAN(fVar2) || NAN((float)local_28.field_0.i32))) {
          if (fVar2 <= (float)local_28.field_0.i32) {
            local_28.field_0._0_4_ = fVar2;
          }
          *(undefined4 *)&__return_storage_ptr__->field_0 = local_28.field_0.i32;
        }
        else {
          if (-1 < (int)fVar2) {
            fVar2 = (float)local_28.field_0.i32;
          }
          *(float *)&__return_storage_ptr__->field_0 = fVar2;
        }
        (__return_storage_ptr__->type).id = 4;
        return __return_storage_ptr__;
      }
      local_28.type.id = 4;
      standardizeNaN(__return_storage_ptr__,&local_28);
    }
  }
  ~Literal(&local_28);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::min(const Literal& other) const {
  switch (type.getBasic()) {
    case Type::f32: {
      auto l = getf32(), r = other.getf32();
      if (std::isnan(l)) {
        return standardizeNaN(Literal(l));
      }
      if (std::isnan(r)) {
        return standardizeNaN(Literal(r));
      }
      if (l == r && l == 0) {
        return Literal(std::signbit(l) ? l : r);
      }
      return Literal(std::min(l, r));
    }
    case Type::f64: {
      auto l = getf64(), r = other.getf64();
      if (std::isnan(l)) {
        return standardizeNaN(Literal(l));
      }
      if (std::isnan(r)) {
        return standardizeNaN(Literal(r));
      }
      if (l == r && l == 0) {
        return Literal(std::signbit(l) ? l : r);
      }
      return Literal(std::min(l, r));
    }
    default:
      WASM_UNREACHABLE("unexpected type");
  }
}